

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseColEtree.h
# Opt level: O0

int Eigen::internal::coletree<Eigen::SparseMatrix<double,0,int>,Eigen::Matrix<int,_1,1,0,_1,1>>
              (SparseMatrix<double,_0,_int> *mat,Matrix<int,__1,_1,_0,__1,_1> *parent,
              Matrix<int,__1,_1,_0,__1,_1> *firstRowElt,Index *perm)

{
  int iVar1;
  Index IVar2;
  bool bVar3;
  Index IVar4;
  int iVar5;
  int *piVar6;
  Scalar *pSVar7;
  char *pcVar8;
  int __c;
  Matrix<int,__1,_1,_0,__1,_1> *pMVar9;
  byte local_15d;
  int local_fc;
  undefined1 local_f8 [4];
  Index i;
  InnerIterator it_1;
  Index pcol_1;
  Index rroot;
  Index cset;
  Index rset;
  InnerIterator it;
  Index pcol;
  Scalar SStack_9c;
  bool found_diag;
  SegmentReturnType local_98;
  int local_70;
  Index local_6c;
  Index col;
  Index row;
  Matrix<int,__1,_1,_0,__1,_1> pp;
  undefined1 local_48 [8];
  Matrix<int,__1,_1,_0,__1,_1> root;
  Index local_30;
  Index diagSize;
  Index m;
  Index nc;
  Index *perm_local;
  Matrix<int,__1,_1,_0,__1,_1> *firstRowElt_local;
  Matrix<int,__1,_1,_0,__1,_1> *parent_local;
  SparseMatrix<double,_0,_int> *mat_local;
  
  _m = perm;
  perm_local = (Index *)firstRowElt;
  firstRowElt_local = parent;
  parent_local = (Matrix<int,__1,_1,_0,__1,_1> *)mat;
  diagSize = SparseMatrix<double,_0,_int>::cols(mat);
  local_30 = SparseMatrix<double,_0,_int>::rows((SparseMatrix<double,_0,_int> *)parent_local);
  piVar6 = std::min<int>(&diagSize,&local_30);
  root.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ = *piVar6;
  Matrix<int,_-1,_1,_0,_-1,_1>::Matrix((Matrix<int,__1,_1,_0,__1,_1> *)local_48,(long)diagSize);
  DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)local_48);
  Matrix<int,_-1,_1,_0,_-1,_1>::Matrix((Matrix<int,__1,_1,_0,__1,_1> *)&col,(long)diagSize);
  DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)&col);
  pMVar9 = firstRowElt_local;
  IVar4 = SparseMatrix<double,_0,_int>::cols((SparseMatrix<double,_0,_int> *)parent_local);
  PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::resize
            (&pMVar9->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>,(long)IVar4);
  PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)perm_local,(long)local_30);
  DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::setConstant
            ((DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)perm_local,&diagSize);
  DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::segment
            (&local_98,(DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)perm_local,0,
             (long)root.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                   ._4_4_);
  SStack_9c = 0;
  pcol = root.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ +
         -1;
  DenseBase<Eigen::Block<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_-1,_1,_false>_>::setLinSpaced
            ((DenseBase<Eigen::Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
             &local_98,
             (long)root.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                   ._4_4_,&stack0xffffffffffffff64,&pcol);
  for (local_70 = 0; local_70 < diagSize; local_70 = local_70 + 1) {
    it.m_end = local_70;
    if (_m != (Index *)0x0) {
      it.m_end = _m[local_70];
    }
    SparseMatrix<double,_0,_int>::InnerIterator::InnerIterator
              ((InnerIterator *)&cset,(SparseMatrix<double,_0,_int> *)parent_local,it.m_end);
    while (bVar3 = SparseMatrix::InnerIterator::operator_cast_to_bool((InnerIterator *)&cset), bVar3
          ) {
      local_6c = SparseMatrix<double,_0,_int>::InnerIterator::row((InnerIterator *)&cset);
      pSVar7 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)perm_local,
                          (long)local_6c);
      piVar6 = std::min<int>(pSVar7,&local_70);
      iVar1 = *piVar6;
      pSVar7 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)perm_local,
                          (long)local_6c);
      *pSVar7 = iVar1;
      SparseMatrix<double,_0,_int>::InnerIterator::operator++((InnerIterator *)&cset);
    }
  }
  for (local_70 = 0; iVar1 = local_70, local_70 < diagSize; local_70 = local_70 + 1) {
    it._31_1_ = local_30 <= local_70;
    pSVar7 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&col,
                        (long)local_70);
    iVar5 = local_70;
    *pSVar7 = iVar1;
    pcol_1 = local_70;
    pSVar7 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)local_48,
                        (long)local_70);
    IVar2 = diagSize;
    *pSVar7 = iVar5;
    pSVar7 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)firstRowElt_local
                        ,(long)local_70);
    *pSVar7 = IVar2;
    it_1.m_end = local_70;
    if (_m != (Index *)0x0) {
      it_1.m_end = _m[local_70];
    }
    pMVar9 = parent_local;
    SparseMatrix<double,_0,_int>::InnerIterator::InnerIterator
              ((InnerIterator *)local_f8,(SparseMatrix<double,_0,_int> *)parent_local,it_1.m_end);
    while( true ) {
      bVar3 = SparseMatrix::InnerIterator::operator_cast_to_bool((InnerIterator *)local_f8);
      local_15d = 1;
      if (!bVar3) {
        local_15d = it._31_1_ ^ 0xff;
      }
      if ((local_15d & 1) == 0) break;
      local_fc = local_70;
      bVar3 = SparseMatrix::InnerIterator::operator_cast_to_bool((InnerIterator *)local_f8);
      if (bVar3) {
        pcVar8 = SparseMatrix<double,_0,_int>::InnerIterator::index
                           ((InnerIterator *)local_f8,(char *)pMVar9,__c);
        local_fc = (int)pcVar8;
      }
      if (local_fc == local_70) {
        it._31_1_ = 1;
      }
      pMVar9 = (Matrix<int,__1,_1,_0,__1,_1> *)(long)local_fc;
      pSVar7 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)perm_local,
                          (Index)pMVar9);
      local_6c = *pSVar7;
      if (local_6c < local_70) {
        iVar5 = etree_find<int,Eigen::Matrix<int,_1,1,0,_1,1>>
                          (local_6c,(Matrix<int,__1,_1,_0,__1,_1> *)&col);
        pMVar9 = (Matrix<int,__1,_1,_0,__1,_1> *)(long)iVar5;
        pSVar7 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)local_48,
                            (Index)pMVar9);
        iVar1 = local_70;
        it_1._28_4_ = *pSVar7;
        if (it_1._28_4_ != local_70) {
          pSVar7 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)
                              firstRowElt_local,(long)(int)it_1._28_4_);
          *pSVar7 = iVar1;
          pSVar7 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&col,
                              (long)pcol_1);
          iVar1 = local_70;
          *pSVar7 = iVar5;
          pMVar9 = (Matrix<int,__1,_1,_0,__1,_1> *)(long)iVar5;
          pSVar7 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)local_48,
                              (Index)pMVar9);
          *pSVar7 = iVar1;
          pcol_1 = iVar5;
        }
      }
      SparseMatrix<double,_0,_int>::InnerIterator::operator++((InnerIterator *)local_f8);
    }
  }
  Matrix<int,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<int,__1,_1,_0,__1,_1> *)&col);
  Matrix<int,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<int,__1,_1,_0,__1,_1> *)local_48);
  return 0;
}

Assistant:

int coletree(const MatrixType& mat, IndexVector& parent, IndexVector& firstRowElt, typename MatrixType::Index *perm=0)
{
  typedef typename MatrixType::Index Index;
  Index nc = mat.cols(); // Number of columns 
  Index m = mat.rows();
  Index diagSize = (std::min)(nc,m);
  IndexVector root(nc); // root of subtree of etree 
  root.setZero();
  IndexVector pp(nc); // disjoint sets 
  pp.setZero(); // Initialize disjoint sets 
  parent.resize(mat.cols());
  //Compute first nonzero column in each row 
  Index row,col; 
  firstRowElt.resize(m);
  firstRowElt.setConstant(nc);
  firstRowElt.segment(0, diagSize).setLinSpaced(diagSize, 0, diagSize-1);
  bool found_diag;
  for (col = 0; col < nc; col++)
  {
    Index pcol = col;
    if(perm) pcol  = perm[col];
    for (typename MatrixType::InnerIterator it(mat, pcol); it; ++it)
    { 
      row = it.row();
      firstRowElt(row) = (std::min)(firstRowElt(row), col);
    }
  }
  /* Compute etree by Liu's algorithm for symmetric matrices,
          except use (firstRowElt[r],c) in place of an edge (r,c) of A.
    Thus each row clique in A'*A is replaced by a star
    centered at its first vertex, which has the same fill. */
  Index rset, cset, rroot; 
  for (col = 0; col < nc; col++) 
  {
    found_diag = col>=m;
    pp(col) = col; 
    cset = col; 
    root(cset) = col; 
    parent(col) = nc; 
    /* The diagonal element is treated here even if it does not exist in the matrix
     * hence the loop is executed once more */ 
    Index pcol = col;
    if(perm) pcol  = perm[col];
    for (typename MatrixType::InnerIterator it(mat, pcol); it||!found_diag; ++it)
    { //  A sequence of interleaved find and union is performed 
      Index i = col;
      if(it) i = it.index();
      if (i == col) found_diag = true;
      
      row = firstRowElt(i);
      if (row >= col) continue; 
      rset = internal::etree_find(row, pp); // Find the name of the set containing row
      rroot = root(rset);
      if (rroot != col) 
      {
        parent(rroot) = col; 
        pp(cset) = rset; 
        cset = rset; 
        root(cset) = col; 
      }
    }
  }
  return 0;  
}